

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O0

bool __thiscall iDynTree::BerdySparseMAPSolver::doEstimate(BerdySparseMAPSolver *this)

{
  bool computePermutation;
  bool in_stack_00000d4f;
  BerdySparseMAPSolverPimpl *in_stack_00000d50;
  
  BerdySparseMAPSolverPimpl::computeMAP(in_stack_00000d50,in_stack_00000d4f);
  return true;
}

Assistant:

bool BerdySparseMAPSolver::doEstimate()
    {
        assert(m_pimpl);
        using iDynTree::toEigen;
#ifdef EIGEN_RUNTIME_NO_MALLOC
        Eigen::internal::set_is_malloc_allowed(false);
#endif
        bool computePermutation = false;
        m_pimpl->computeMAP(computePermutation);

#ifdef EIGEN_RUNTIME_NO_MALLOC
        Eigen::internal::set_is_malloc_allowed(true);
#endif
        return true;
    }